

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.c
# Opt level: O1

void ptls_minicrypto_random_bytes(void *buf,size_t len)

{
  cf_hash_drbg_sha256 *ctx;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uint32_t uVar4;
  uint __fd;
  ssize_t sVar5;
  int *piVar6;
  long extraout_RDX;
  undefined8 *puVar7;
  char *pcVar8;
  size_t __nbytes;
  undefined8 *__buf;
  long *in_FS_OFFSET;
  uint8_t entropy [256];
  undefined8 local_138 [16];
  undefined1 local_b8 [136];
  
  ctx = (cf_hash_drbg_sha256 *)(*in_FS_OFFSET + -0x74);
  uVar4 = cf_hash_drbg_sha256_needs_reseed(ctx);
  if (uVar4 != 0) {
    __fd = open("/dev/urandom",0x80000);
    if (__fd == 0xffffffff) {
      pcVar8 = "/dev/random";
      puVar7 = (undefined8 *)0x80000;
      __fd = open("/dev/random",0x80000);
      if (__fd == 0xffffffff) {
LAB_00110f0e:
        ptls_minicrypto_random_bytes_cold_2();
        if (extraout_RDX == 0x20) {
          *(code **)pcVar8 = secp256r1sha256_sign;
          uVar1 = puVar7[1];
          uVar2 = puVar7[2];
          uVar3 = puVar7[3];
          *(undefined8 *)(pcVar8 + 8) = *puVar7;
          *(undefined8 *)(pcVar8 + 0x10) = uVar1;
          *(undefined8 *)(pcVar8 + 0x18) = uVar2;
          *(undefined8 *)(pcVar8 + 0x20) = uVar3;
        }
        return;
      }
    }
    __nbytes = 0x100;
    __buf = local_138;
LAB_00110e81:
    do {
      pcVar8 = (char *)(ulong)__fd;
      puVar7 = __buf;
      sVar5 = read(__fd,__buf,__nbytes);
      if (sVar5 == -1) {
        piVar6 = __errno_location();
        if (*piVar6 == 4) goto LAB_00110e81;
      }
      if (sVar5 < 0) {
        ptls_minicrypto_random_bytes_cold_1();
        goto LAB_00110f0e;
      }
      __buf = (undefined8 *)((long)__buf + sVar5);
      __nbytes = __nbytes - sVar5;
    } while (__nbytes != 0);
    close(__fd);
    cf_hash_drbg_sha256_init(ctx,local_138,0x80,local_b8,0x80,"ptls",4);
  }
  cf_hash_drbg_sha256_gen(ctx,buf,len);
  return;
}

Assistant:

void ptls_minicrypto_random_bytes(void *buf, size_t len)
{
    static PTLS_THREADLOCAL cf_hash_drbg_sha256 ctx;

    if (cf_hash_drbg_sha256_needs_reseed(&ctx)) {
        uint8_t entropy[256];
        read_entropy(entropy, sizeof(entropy));
        cf_hash_drbg_sha256_init(&ctx, entropy, sizeof(entropy) / 2, entropy + sizeof(entropy) / 2, sizeof(entropy) / 2, "ptls", 4);
    }
    cf_hash_drbg_sha256_gen(&ctx, buf, len);
}